

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encrypt.c
# Opt level: O2

_Bool COSE_Enveloped_encrypt(HCOSE_ENVELOPED h,cose_errback *perr)

{
  _Bool _Var1;
  
  _Var1 = IsValidEnvelopedHandle(h);
  if ((_Var1) && (*(long *)(h + 0x68) != 0)) {
    _Var1 = _COSE_Enveloped_encrypt((COSE_Enveloped *)h,(byte *)0x0,0,"Encrypt",perr);
    return _Var1;
  }
  if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_HANDLE;
  }
  return false;
}

Assistant:

bool COSE_Enveloped_encrypt(HCOSE_ENVELOPED h, cose_errback * perr)
{
	COSE_Enveloped * pcose = (COSE_Enveloped *)h;

	CHECK_CONDITION(IsValidEnvelopedHandle(h), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(pcose->m_recipientFirst != NULL, COSE_ERR_INVALID_HANDLE);

	return _COSE_Enveloped_encrypt(pcose, NULL, 0, "Encrypt", perr);

errorReturn:
	return false;
}